

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_files_list.cpp
# Opt level: O0

int main(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  reference archivePath_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  CpioException *e;
  PosixException *e_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *archivePath;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88 [32];
  string local_68 [32];
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  archivePaths;
  _func_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_string_ptr
  *getFilesListFunc;
  void *handle;
  
  handle._4_4_ = 0;
  lVar2 = dlopen("../libcpio-lite.so",2);
  if (lVar2 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Failed to load cpio-lite.so: ");
    pcVar4 = (char *)dlerror();
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    handle._4_4_ = -1;
  }
  else {
    archivePaths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)dlsym(lVar2,"getFilesList");
    if (archivePaths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Failed to find symbol \'getFilesList\': ");
      pcVar4 = (char *)dlerror();
      poVar3 = std::operator<<(poVar3,pcVar4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      handle._4_4_ = -1;
    }
    else {
      __range1._1_1_ = 1;
      local_b0 = &local_a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"./testfiles/cpio_archives/directory.cpio",&local_b1);
      local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_88,"./testfiles/cpio_archives/onetwothree.cpio",
                 (allocator<char> *)((long)&__range1 + 3));
      local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_68,"./testfiles/cpio_archives/links_dirs_regs.cpio",
                 (allocator<char> *)((long)&__range1 + 2));
      __range1._1_1_ = 0;
      local_48 = &local_a8;
      local_40 = 3;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__range1);
      __l._M_len = local_40;
      __l._M_array = local_48;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_38,__l,
               (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__range1);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&__range1);
      local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
      do {
        local_150 = local_150 + -1;
        std::__cxx11::string::~string((string *)local_150);
      } while (local_150 != &local_a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 2));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 3));
      std::allocator<char>::~allocator(&local_b1);
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_38);
      archivePath = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_38);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&archivePath);
        if (!bVar1) break;
        archivePath_00 =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
        getAndPrintFilesList
                  ((_func_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_string_ptr
                    *)archivePaths.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,archivePath_00);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38);
    }
  }
  return handle._4_4_;
}

Assistant:

int main() 
{
	void* handle = dlopen("../libcpio-lite.so", RTLD_NOW);
	if (handle == nullptr) {
		cout << "Failed to load cpio-lite.so: " << dlerror() << endl;		
		return -1;
	}
	auto getFilesListFunc = (decltype(&getFilesList)) dlsym(handle, "getFilesList");
	if (getFilesListFunc == nullptr) {
		cout << "Failed to find symbol 'getFilesList': " << dlerror() << endl;
		return -1;
	}

	vector<string> archivePaths{"./testfiles/cpio_archives/directory.cpio", "./testfiles/cpio_archives/onetwothree.cpio", "./testfiles/cpio_archives/links_dirs_regs.cpio"};	

	try
	{
		for (const auto& archivePath : archivePaths)
			getAndPrintFilesList(getFilesListFunc, archivePath);
		
	}
	catch (CpioException& e)
	{
		cout << e.what() << ", error type: " << e.errorType() << endl;
		return -1;
	}
	catch (PosixException& e)
	{
		cout << e.what() << ", error code: " << e.errorCode() << endl;
		return -1;
	}
}